

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O3

void predict_or_learn_multi<false,true>(nn *n,single_learner *base,example *ec)

{
  uchar **ppuVar1;
  polylabel *ppVar2;
  uint64_t *puVar3;
  float fVar4;
  int iVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  shared_data *psVar9;
  _func_void_shared_data_ptr_float *p_Var10;
  loss_function *plVar11;
  bool *pbVar12;
  polyprediction *ppVar13;
  shared_data *psVar14;
  uint64_t uVar15;
  _func_void_int_string_v_array<char> *p_Var16;
  float fVar17;
  float fVar18;
  label_t lVar19;
  label_t lVar20;
  label_t lVar21;
  v_array<char> vVar22;
  polylabel *ppVar23;
  undefined4 uVar24;
  bool bVar25;
  uint uVar26;
  long lVar27;
  uint64_t uVar28;
  ostream *poVar29;
  undefined8 uVar30;
  polyprediction *ppVar31;
  features *pfVar32;
  char *pcVar33;
  features *pfVar34;
  features *pfVar35;
  code *pcVar36;
  uint i;
  vw *all;
  float *pfVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  byte bVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  features save_nn_output_namespace;
  ostringstream outputStringStream;
  shared_data sd;
  undefined8 in_stack_fffffffffffffc58;
  example *peVar45;
  label_t *plVar46;
  float fVar47;
  float fVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  float local_37c;
  float local_378;
  float local_374;
  undefined1 *local_310;
  undefined1 local_300 [16];
  char local_2f0 [96];
  float local_290;
  undefined1 local_288 [376];
  shared_data local_110;
  
  bVar41 = 0;
  all = n->all;
  iVar5 = all->raw_prediction;
  if (n->finished_setup == false) {
    finish_setup(n,all);
    all = n->all;
  }
  memcpy(&local_110,all->sd,0xe0);
  psVar9 = all->sd;
  all->sd = &local_110;
  if (n->dropout == false) {
    fVar42 = 1.0;
  }
  else {
    fVar42 = 2.0;
  }
  fVar4 = (ec->l).simple.label;
  p_Var10 = n->all->set_minmax;
  plVar11 = n->all->loss;
  pbVar12 = n->dropped_out;
  ppVar13 = n->hidden_units_pred;
  uVar49 = SUB84(n->hiddenbias_pred,0);
  uVar50 = (undefined4)((ulong)n->hiddenbias_pred >> 0x20);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
  n->all->set_minmax = noop_mm;
  n->all->loss = n->squared_loss;
  psVar14 = n->all->sd;
  fVar48 = psVar14->min_label;
  psVar14->min_label = -3.0;
  psVar14 = n->all->sd;
  fVar47 = psVar14->max_label;
  psVar14->max_label = 3.0;
  uVar15 = (ec->super_example_predict).ft_offset;
  uVar28 = uVar15;
  if (n->multitask == true) {
    (ec->super_example_predict).ft_offset = 0;
    uVar28 = 0;
  }
  peVar45 = &n->hiddenbias;
  (n->hiddenbias).super_example_predict.ft_offset = uVar28;
  uVar26 = n->k;
  uVar40 = (ulong)uVar26;
  if (*(code **)(base + 0x40) == (code *)0x0) {
    if (uVar40 != 0) {
      lVar27 = 0;
      do {
        (**(code **)(base + 0x30))
                  (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar45);
        fVar43 = (n->hiddenbias).pred.scalar;
        fVar44 = *(float *)((long)&(n->hiddenbias).pred + 4);
        fVar17 = *(float *)((long)&(n->hiddenbias).pred + 8);
        fVar18 = *(float *)((long)&(n->hiddenbias).pred + 0xc);
        *(undefined1 (*) [16])(CONCAT44(uVar50,uVar49) + 0x10 + lVar27) =
             *(undefined1 (*) [16])((long)&(n->hiddenbias).pred + 0x10);
        pfVar37 = (float *)(CONCAT44(uVar50,uVar49) + lVar27);
        *pfVar37 = fVar43;
        pfVar37[1] = fVar44;
        pfVar37[2] = fVar17;
        pfVar37[3] = fVar18;
        uVar28 = (ulong)*(uint *)(base + 0xe0) + (n->hiddenbias).super_example_predict.ft_offset;
        (n->hiddenbias).super_example_predict.ft_offset = uVar28;
        lVar27 = lVar27 + 0x20;
      } while (uVar40 << 5 != lVar27);
    }
    uVar28 = uVar28 - uVar26 * *(int *)(base + 0xe0);
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar45,uVar40,
               *(undefined8 *)(base + 0xe0),CONCAT44(uVar50,uVar49),1);
    uVar28 = (n->hiddenbias).super_example_predict.ft_offset;
  }
  (n->hiddenbias).super_example_predict.ft_offset = uVar28;
  uVar26 = n->k;
  if (uVar26 == 0) {
    pcVar36 = *(code **)(base + 0x40);
    if (pcVar36 != (code *)0x0) {
      uVar40 = 0;
      goto LAB_001f084a;
    }
    uVar28 = (ec->super_example_predict).ft_offset;
    uVar26 = 0;
  }
  else {
    uVar39 = 0;
    pfVar37 = (float *)CONCAT44(uVar50,uVar49);
    do {
      if ((*pfVar37 == 0.0) && (!NAN(*pfVar37))) {
        fVar43 = merand48(&n->all->random_state);
        (n->hiddenbias).l.simple.label = fVar43 + -0.5;
        puVar3 = &(n->hiddenbias).super_example_predict.ft_offset;
        *puVar3 = *puVar3 + (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar39);
        (**(code **)(base + 0x28))
                  (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar45);
        puVar3 = &(n->hiddenbias).super_example_predict.ft_offset;
        *puVar3 = *puVar3 - (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar39);
        (n->hiddenbias).l.multi.label = 0x7f7fffff;
        uVar26 = n->k;
      }
      uVar39 = uVar39 + 1;
      uVar40 = (ulong)uVar26;
      pfVar37 = pfVar37 + 8;
    } while (uVar39 < uVar40);
    pcVar36 = *(code **)(base + 0x40);
    if (pcVar36 != (code *)0x0) {
LAB_001f084a:
      (*pcVar36)(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,uVar40,
                 *(undefined8 *)(base + 0xe0),ppVar13,1);
      uVar28 = (ec->super_example_predict).ft_offset;
      goto LAB_001f0894;
    }
    if (uVar26 == 0) {
      uVar28 = (ec->super_example_predict).ft_offset;
    }
    else {
      lVar27 = uVar40 << 5;
      lVar38 = 0;
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        fVar43 = (ec->pred).scalar;
        fVar44 = *(float *)((long)&ec->pred + 4);
        fVar17 = *(float *)((long)&ec->pred + 8);
        fVar18 = *(float *)((long)&ec->pred + 0xc);
        *(undefined1 (*) [16])((long)ppVar13 + lVar38 + 0x10) =
             *(undefined1 (*) [16])((long)&ec->pred + 0x10);
        pfVar37 = (float *)((long)ppVar13 + lVar38);
        *pfVar37 = fVar43;
        pfVar37[1] = fVar44;
        pfVar37[2] = fVar17;
        pfVar37[3] = fVar18;
        uVar28 = (ulong)*(uint *)(base + 0xe0) + (ec->super_example_predict).ft_offset;
        (ec->super_example_predict).ft_offset = uVar28;
        lVar38 = lVar38 + 0x20;
      } while (lVar27 != lVar38);
    }
  }
  uVar28 = uVar28 - uVar26 * *(int *)(base + 0xe0);
LAB_001f0894:
  (ec->super_example_predict).ft_offset = uVar28;
  if (n->k != 0) {
    uVar40 = 0;
    do {
      if (n->dropout == true) {
        fVar43 = merand48(&n->xsubi);
        bVar25 = fVar43 < 0.5;
      }
      else {
        bVar25 = false;
      }
      pbVar12[uVar40] = bVar25;
      uVar40 = uVar40 + 1;
      uVar26 = n->k;
    } while (uVar40 < uVar26);
    pfVar34 = ec->passthrough;
    if (uVar26 != 0 && pfVar34 != (features *)0x0) {
      uVar39 = 1;
      uVar40 = 1;
      lVar27 = 0;
      while( true ) {
        if (pfVar34 != (features *)0x0) {
          features::push_back(pfVar34,*(feature_value *)(CONCAT44(uVar50,uVar49) + lVar27),
                              (ulong)((int)uVar39 - 1) ^ 0x398d9fda640553);
          if (ec->passthrough != (features *)0x0) {
            features::push_back(ec->passthrough,*(feature_value *)((long)ppVar13 + lVar27),
                                uVar39 ^ 0x398d9fda640553);
          }
        }
        uVar26 = n->k;
        if (uVar26 <= uVar40) break;
        pfVar34 = ec->passthrough;
        lVar27 = lVar27 + 0x20;
        uVar39 = (ulong)((int)uVar39 + 2);
        uVar40 = uVar40 + 1;
      }
    }
    if (uVar26 != 0 && 0 < iVar5) {
      uVar40 = 0;
      ppVar31 = ppVar13;
      do {
        if (uVar40 != 0) {
          local_2f0[0] = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,local_2f0,1);
        }
        poVar29 = std::ostream::_M_insert<unsigned_long>((ulong)local_288);
        local_2f0[0] = ':';
        std::__ostream_insert<char,std::char_traits<char>>(poVar29,local_2f0,1);
        poVar29 = std::ostream::_M_insert<double>((double)ppVar31->scalar);
        local_2f0[0] = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar29,local_2f0,1);
        fVar44 = ppVar31->scalar * -2.0 * 1.442695;
        fVar43 = -126.0;
        if (-126.0 <= fVar44) {
          fVar43 = fVar44;
        }
        fVar44 = (fVar43 - (float)(int)fVar43) + (float)(-(uint)(fVar44 < 0.0) & 0x3f800000);
        std::ostream::_M_insert<double>
                  ((double)(2.0 / ((float)(long)((fVar44 * -1.4901291 +
                                                 27.728024 / (4.8425255 - fVar44) +
                                                 fVar43 + 121.274055) * 8388608.0) + 1.0) + -1.0));
        uVar40 = uVar40 + 1;
        ppVar31 = ppVar31 + 1;
      } while (uVar40 < n->k);
    }
  }
  plVar46 = (label_t *)&ec->l;
  n->all->loss = plVar11;
  n->all->set_minmax = p_Var10;
  n->all->sd->min_label = fVar48;
  n->all->sd->max_label = fVar47;
  (ec->super_example_predict).ft_offset = uVar15;
  ppVar2 = &(n->output_layer).l;
  pfVar34 = (ec->super_example_predict).feature_space + 0x81;
  uVar30 = CONCAT71((int7)((ulong)&ec->tag >> 8),1);
  local_378 = 0.0;
  local_374 = 0.0;
  local_37c = 0.0;
  while( true ) {
    uVar26 = (uint)uVar30;
    (n->output_layer).total_sum_feat_sq = 1.0;
    (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq = 1.0;
    (n->outputweight).super_example_predict.ft_offset = (ec->super_example_predict).ft_offset;
    n->all->set_minmax = noop_mm;
    n->all->loss = n->squared_loss;
    psVar14 = n->all->sd;
    fVar48 = psVar14->min_label;
    psVar14->min_label = -1.0;
    psVar14 = n->all->sd;
    fVar47 = psVar14->max_label;
    psVar14->max_label = 1.0;
    if (n->k != 0) {
      uVar40 = 0;
      ppVar31 = ppVar13;
      do {
        fVar43 = 0.0;
        if (pbVar12[uVar40] == false) {
          fVar44 = ppVar31->scalar * -2.0 * 1.442695;
          fVar43 = -126.0;
          if (-126.0 <= fVar44) {
            fVar43 = fVar44;
          }
          fVar44 = (fVar43 - (float)(int)fVar43) + (float)(-(uint)(fVar44 < 0.0) & 0x3f800000);
          fVar43 = (2.0 / ((float)(long)((fVar44 * -1.4901291 +
                                         27.728024 / (4.8425255 - fVar44) + fVar43 + 121.274055) *
                                        8388608.0) + 1.0) + -1.0) * fVar42;
        }
        (n->output_layer).super_example_predict.feature_space[0x81].values._begin[uVar40] = fVar43;
        (n->output_layer).total_sum_feat_sq = (n->output_layer).total_sum_feat_sq + fVar43 * fVar43;
        (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq =
             fVar43 * fVar43 +
             (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
        *(n->outputweight).super_example_predict.feature_space[0x81].indicies._begin =
             (n->output_layer).super_example_predict.feature_space[0x81].indicies._begin[uVar40];
        uVar6 = n->k;
        puVar3 = &(n->outputweight).super_example_predict.ft_offset;
        *puVar3 = *puVar3 + (ulong)(*(int *)(base + 0xe0) * uVar6);
        (**(code **)(base + 0x30))
                  (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&n->outputweight);
        puVar3 = &(n->outputweight).super_example_predict.ft_offset;
        *puVar3 = *puVar3 - (ulong)(uVar6 * *(int *)(base + 0xe0));
        fVar43 = (n->outputweight).pred.scalar;
        if ((fVar43 == 0.0) && (!NAN(fVar43))) {
          uVar7 = n->k;
          fVar43 = merand48(&n->all->random_state);
          (n->outputweight).l.simple.label = (fVar43 + -0.5) / SQRT((float)uVar7);
          uVar6 = n->k;
          puVar3 = &(n->outputweight).super_example_predict.ft_offset;
          *puVar3 = *puVar3 + (ulong)(*(int *)(base + 0xe0) * uVar6);
          (**(code **)(base + 0x38))
                    (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&n->outputweight);
          puVar3 = &(n->outputweight).super_example_predict.ft_offset;
          *puVar3 = *puVar3 - (ulong)(uVar6 * *(int *)(base + 0xe0));
          (n->outputweight).l.multi.label = 0x7f7fffff;
        }
        uVar40 = uVar40 + 1;
        ppVar31 = ppVar31 + 1;
      } while (uVar40 < n->k);
    }
    n->all->loss = plVar11;
    n->all->set_minmax = p_Var10;
    n->all->sd->min_label = fVar48;
    n->all->sd->max_label = fVar47;
    if (n->inpass == false) {
      uVar15 = (ec->super_example_predict).ft_offset;
      (n->output_layer).super_example_predict.ft_offset = uVar15;
      (n->output_layer).l.cb_eval.event.costs.erase_count = (size_t)plVar46[4];
      lVar19 = *plVar46;
      lVar20 = plVar46[1];
      lVar21 = plVar46[3];
      (n->output_layer).l.cs.costs.end_array = (wclass *)plVar46[2];
      (n->output_layer).l.cs.costs.erase_count = (size_t)lVar21;
      ppVar2->multi = lVar19;
      (n->output_layer).l.cs.costs._end = (wclass *)lVar20;
      (n->output_layer).weight = ec->weight;
      (n->output_layer).partial_prediction = 0.0;
      uVar6 = n->k;
      (n->output_layer).super_example_predict.ft_offset = *(int *)(base + 0xe0) * uVar6 + uVar15;
      (**(code **)(base + 0x30))
                (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&n->output_layer);
      puVar3 = &(n->output_layer).super_example_predict.ft_offset;
      *puVar3 = *puVar3 - (ulong)(uVar6 * *(int *)(base + 0xe0));
      ppVar23 = &(n->output_layer).l;
      uVar49 = *(undefined4 *)
                ((long)&(((label *)((long)&ppVar23->cb_eval + 8))->costs).erase_count + 4);
      plVar46[4].label =
           *(undefined4 *)&(((label *)((long)&ppVar23->cb_eval + 8))->costs).erase_count;
      plVar46[4].weight = (float)uVar49;
      lVar19 = ppVar2->multi;
      lVar20 = (label_t)(n->output_layer).l.cs.costs._end;
      uVar49 = *(undefined4 *)((long)&(n->output_layer).l + 0x18);
      uVar24 = *(undefined4 *)((long)&(n->output_layer).l + 0x1c);
      plVar46[2] = (label_t)(n->output_layer).l.cs.costs.end_array;
      plVar46[3].label = uVar49;
      plVar46[3].weight = (float)uVar24;
      *plVar46 = lVar19;
      plVar46[1] = lVar20;
    }
    else {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec,&nn_output_namespace);
      pfVar32 = pfVar34;
      pcVar33 = local_2f0;
      for (lVar27 = 0xd; lVar27 != 0; lVar27 = lVar27 + -1) {
        *(float **)pcVar33 = (pfVar32->values)._begin;
        pfVar32 = (features *)((long)pfVar32 + (ulong)bVar41 * -0x10 + 8);
        pcVar33 = pcVar33 + ((ulong)bVar41 * -2 + 1) * 8;
      }
      pfVar32 = (n->output_layer).super_example_predict.feature_space + 0x81;
      pfVar35 = pfVar34;
      for (lVar27 = 0xc; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pfVar35->values)._begin = (pfVar32->values)._begin;
        pfVar32 = (features *)((long)pfVar32 + (ulong)bVar41 * -0x10 + 8);
        pfVar35 = (features *)((long)pfVar35 + (ulong)bVar41 * -0x10 + 8);
      }
      (ec->super_example_predict).feature_space[0x81].sum_feat_sq =
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
      ec->total_sum_feat_sq =
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq +
           ec->total_sum_feat_sq;
      uVar6 = n->k;
      puVar3 = &(ec->super_example_predict).ft_offset;
      *puVar3 = *puVar3 + (ulong)(*(int *)(base + 0xe0) * uVar6);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar3 = &(ec->super_example_predict).ft_offset;
      *puVar3 = *puVar3 - (ulong)(uVar6 * *(int *)(base + 0xe0));
      (n->output_layer).partial_prediction = ec->partial_prediction;
      (n->output_layer).loss = ec->loss;
      ec->total_sum_feat_sq =
           ec->total_sum_feat_sq -
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
      pcVar33 = local_2f0;
      pfVar32 = pfVar34;
      for (lVar27 = 0xc; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pfVar32->values)._begin = *(float **)pcVar33;
        pcVar33 = pcVar33 + ((ulong)bVar41 * -2 + 1) * 8;
        pfVar32 = (features *)((long)pfVar32 + (ulong)bVar41 * -0x10 + 8);
      }
      (ec->super_example_predict).feature_space[0x81].sum_feat_sq = local_290;
      ppuVar1 = &(ec->super_example_predict).indices._end;
      *ppuVar1 = *ppuVar1 + -1;
    }
    fVar43 = GD::finalize_prediction(n->all->sd,(n->output_layer).partial_prediction);
    n->prediction = fVar43;
    if (0 < iVar5) {
      local_2f0[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,local_2f0,1);
      std::ostream::_M_insert<double>((double)(n->output_layer).partial_prediction);
      p_Var16 = n->all->print_text;
      iVar8 = n->all->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar22._end = (char *)plVar46;
      vVar22._begin = (char *)in_stack_fffffffffffffc58;
      vVar22.end_array._0_4_ = uVar26;
      vVar22.end_array._4_4_ = fVar47;
      vVar22.erase_count._0_4_ = fVar48;
      vVar22.erase_count._4_4_ = uVar50;
      (*p_Var16)(iVar8,(string)ec->tag,vVar22);
      if (local_310 != local_300) {
        operator_delete(local_310);
      }
    }
    plVar46->label = (uint32_t)fVar4;
    if ((uVar26 & 1) != 0) {
      local_374 = n->prediction;
      local_378 = (n->output_layer).partial_prediction;
      local_37c = (n->output_layer).loss;
    }
    if (((byte)uVar26 & 1 & n->dropout) != 1) break;
    uVar30 = 0;
    if (n->k != 0) {
      uVar40 = 0;
      do {
        pbVar12[uVar40] = (bool)(pbVar12[uVar40] ^ 1);
        uVar40 = uVar40 + 1;
      } while (uVar40 < n->k);
      uVar30 = 0;
    }
  }
  ec->partial_prediction = local_378;
  (ec->pred).scalar = local_374;
  ec->loss = local_37c;
  n->all->sd = psVar9;
  (*n->all->set_minmax)(n->all->sd,local_110.min_label);
  (*n->all->set_minmax)(n->all->sd,local_110.max_label);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
  std::ios_base::~ios_base((ios_base *)(local_288 + 0x70));
  return;
}

Assistant:

void predict_or_learn_multi(nn& n, single_learner& base, example& ec)
{
  bool shouldOutput = n.all->raw_prediction > 0;
  if (!n.finished_setup)
    finish_setup(n, *(n.all));
  shared_data sd;
  memcpy(&sd, n.all->sd, sizeof(shared_data));
  shared_data* save_sd = n.all->sd;
  n.all->sd = &sd;

  label_data ld = ec.l.simple;
  void (*save_set_minmax)(shared_data*, float) = n.all->set_minmax;
  float save_min_label;
  float save_max_label;
  float dropscale = n.dropout ? 2.0f : 1.0f;
  loss_function* save_loss = n.all->loss;

  polyprediction* hidden_units = n.hidden_units_pred;
  polyprediction* hiddenbias_pred = n.hiddenbias_pred;
  bool* dropped_out = n.dropped_out;

  ostringstream outputStringStream;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = hidden_min_activation;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = hidden_max_activation;

  uint64_t save_ft_offset = ec.ft_offset;

  if (n.multitask)
    ec.ft_offset = 0;

  n.hiddenbias.ft_offset = ec.ft_offset;

  if (recompute_hidden)
  {
    base.multipredict(n.hiddenbias, 0, n.k, hiddenbias_pred, true);

    for (unsigned int i = 0; i < n.k; ++i)
      // avoid saddle point at 0
      if (hiddenbias_pred[i].scalar == 0)
      {
        n.hiddenbias.l.simple.label = (float)(merand48(n.all->random_state) - 0.5);
        base.learn(n.hiddenbias, i);
        n.hiddenbias.l.simple.label = FLT_MAX;
      }

    base.multipredict(ec, 0, n.k, hidden_units, true);

    for (unsigned int i = 0; i < n.k; ++i) dropped_out[i] = (n.dropout && merand48(n.xsubi) < 0.5);

    if (ec.passthrough)
      for (unsigned int i = 0; i < n.k; ++i)
      {
        add_passthrough_feature(ec, i * 2, hiddenbias_pred[i].scalar);
        add_passthrough_feature(ec, i * 2 + 1, hidden_units[i].scalar);
      }
  }

  if (shouldOutput)
    for (unsigned int i = 0; i < n.k; ++i)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << i << ':' << hidden_units[i].scalar << ','
                         << fasttanh(hidden_units[i].scalar);  // TODO: huh, what was going on here?
    }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;
  ec.ft_offset = save_ft_offset;

  bool converse = false;
  float save_partial_prediction = 0;
  float save_final_prediction = 0;
  float save_ec_loss = 0;

CONVERSE:  // That's right, I'm using goto.  So sue me.

  n.output_layer.total_sum_feat_sq = 1;
  n.output_layer.feature_space[nn_output_namespace].sum_feat_sq = 1;

  n.outputweight.ft_offset = ec.ft_offset;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = -1;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = 1;

  for (unsigned int i = 0; i < n.k; ++i)
  {
    float sigmah = (dropped_out[i]) ? 0.0f : dropscale * fasttanh(hidden_units[i].scalar);
    features& out_fs = n.output_layer.feature_space[nn_output_namespace];
    out_fs.values[i] = sigmah;

    n.output_layer.total_sum_feat_sq += sigmah * sigmah;
    out_fs.sum_feat_sq += sigmah * sigmah;

    n.outputweight.feature_space[nn_output_namespace].indicies[0] = out_fs.indicies[i];
    base.predict(n.outputweight, n.k);
    float wf = n.outputweight.pred.scalar;

    // avoid saddle point at 0
    if (wf == 0)
    {
      float sqrtk = sqrt((float)n.k);
      n.outputweight.l.simple.label = (float)(merand48(n.all->random_state) - 0.5) / sqrtk;
      base.update(n.outputweight, n.k);
      n.outputweight.l.simple.label = FLT_MAX;
    }
  }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;

  if (n.inpass)
  {
    // TODO: this is not correct if there is something in the
    // nn_output_namespace but at least it will not leak memory
    // in that case
    ec.indices.push_back(nn_output_namespace);
    features save_nn_output_namespace = ec.feature_space[nn_output_namespace];
    ec.feature_space[nn_output_namespace] = n.output_layer.feature_space[nn_output_namespace];
    ec.total_sum_feat_sq += n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    if (is_learn)
      base.learn(ec, n.k);
    else
      base.predict(ec, n.k);
    n.output_layer.partial_prediction = ec.partial_prediction;
    n.output_layer.loss = ec.loss;
    ec.total_sum_feat_sq -= n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    ec.feature_space[nn_output_namespace].sum_feat_sq = 0;
    ec.feature_space[nn_output_namespace] = save_nn_output_namespace;
    ec.indices.pop();
  }
  else
  {
    n.output_layer.ft_offset = ec.ft_offset;
    n.output_layer.l = ec.l;
    n.output_layer.weight = ec.weight;
    n.output_layer.partial_prediction = 0;
    if (is_learn)
      base.learn(n.output_layer, n.k);
    else
      base.predict(n.output_layer, n.k);
    ec.l = n.output_layer.l;
  }

  n.prediction = GD::finalize_prediction(n.all->sd, n.output_layer.partial_prediction);

  if (shouldOutput)
  {
    outputStringStream << ' ' << n.output_layer.partial_prediction;
    n.all->print_text(n.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (is_learn && n.all->training && ld.label != FLT_MAX)
  {
    float gradient = n.all->loss->first_derivative(n.all->sd, n.prediction, ld.label);

    if (fabs(gradient) > 0)
    {
      n.all->loss = n.squared_loss;
      n.all->set_minmax = noop_mm;
      save_min_label = n.all->sd->min_label;
      n.all->sd->min_label = hidden_min_activation;
      save_max_label = n.all->sd->max_label;
      n.all->sd->max_label = hidden_max_activation;
      save_ft_offset = ec.ft_offset;

      if (n.multitask)
        ec.ft_offset = 0;

      for (unsigned int i = 0; i < n.k; ++i)
      {
        if (!dropped_out[i])
        {
          float sigmah = n.output_layer.feature_space[nn_output_namespace].values[i] / dropscale;
          float sigmahprime = dropscale * (1.0f - sigmah * sigmah);
          n.outputweight.feature_space[nn_output_namespace].indicies[0] =
              n.output_layer.feature_space[nn_output_namespace].indicies[i];
          base.predict(n.outputweight, n.k);
          float nu = n.outputweight.pred.scalar;
          float gradhw = 0.5f * nu * gradient * sigmahprime;

          ec.l.simple.label = GD::finalize_prediction(n.all->sd, hidden_units[i].scalar - gradhw);
          ec.pred.scalar = hidden_units[i].scalar;
          if (ec.l.simple.label != hidden_units[i].scalar)
            base.update(ec, i);
        }
      }

      n.all->loss = save_loss;
      n.all->set_minmax = save_set_minmax;
      n.all->sd->min_label = save_min_label;
      n.all->sd->max_label = save_max_label;
      ec.ft_offset = save_ft_offset;
    }
  }

  ec.l.simple.label = ld.label;

  if (!converse)
  {
    save_partial_prediction = n.output_layer.partial_prediction;
    save_final_prediction = n.prediction;
    save_ec_loss = n.output_layer.loss;
  }

  if (n.dropout && !converse)
  {
    for (unsigned int i = 0; i < n.k; ++i)
    {
      dropped_out[i] = !dropped_out[i];
    }

    converse = true;
    goto CONVERSE;
  }

  ec.partial_prediction = save_partial_prediction;
  ec.pred.scalar = save_final_prediction;
  ec.loss = save_ec_loss;

  n.all->sd = save_sd;
  n.all->set_minmax(n.all->sd, sd.min_label);
  n.all->set_minmax(n.all->sd, sd.max_label);
}